

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

Am_Point_List * __thiscall
Am_Point_List::Append(Am_Point_List *this,Am_Point_List *other_list,bool unique)

{
  Am_Point_List_Data *this_00;
  float y;
  float x;
  
  if (this->data == (Am_Point_List_Data *)0x0) {
    this_00 = (Am_Point_List_Data *)operator_new(0x20);
    Am_Point_List_Data::Am_Point_List_Data(this_00);
    this->data = this_00;
  }
  else if (unique) {
    Am_Point_List_Data::Make_Unique(this->data,&this->data,&this->item);
  }
  if (other_list->data != (Am_Point_List_Data *)0x0) {
    other_list->item = other_list->data->head;
  }
  while (other_list->item != (Am_Point_Item *)0x0) {
    Get(other_list,&x,&y);
    Add(this,x,y,Am_TAIL,false);
    Next(other_list);
  }
  return this;
}

Assistant:

Am_Point_List &
Am_Point_List::Append(Am_Point_List other_list, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  } else
    data = new Am_Point_List_Data();

  float x, y;
  for (other_list.Start(); !other_list.Last(); other_list.Next()) {
    other_list.Get(x, y);
    Add(x, y, Am_TAIL, false); //only need to make me unique once
  }
  return *this;
}